

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O2

bucket bucket_create(size_t size)

{
  bucket pbVar1;
  bucket pbVar2;
  size_t line;
  char *message;
  bool bVar3;
  
  if (size == 0) {
    message = "Invalid bucket size: %zu";
    line = 0x7b;
  }
  else {
    pbVar1 = (bucket)malloc(size * 0x18);
    pbVar2 = pbVar1;
    if (pbVar1 != (bucket)0x0) {
      while (bVar3 = size != 0, size = size - 1, bVar3) {
        pbVar2->count = 0;
        pbVar2->capacity = 0;
        pbVar2->pairs = (pair)0x0;
        pbVar2 = pbVar2 + 1;
      }
      return pbVar1;
    }
    message = "Bad allocation for bucket";
    line = 0x83;
  }
  log_write_impl_va("metacall",line,"bucket_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,LOG_LEVEL_ERROR,message);
  return (bucket)0x0;
}

Assistant:

bucket bucket_create(size_t size)
{
	bucket buckets;

	size_t iterator;

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket size: %" PRIuS, size);
		return NULL;
	}

	buckets = malloc(sizeof(struct bucket_type) * size);

	if (buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad allocation for bucket");
		return NULL;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		buckets[iterator].count = 0;
		buckets[iterator].capacity = 0;
		buckets[iterator].pairs = NULL;
	}

	return buckets;
}